

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O3

void mafilter2(double *sig,int N,int window,double *oup)

{
  uint uVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if ((window - (window >> 0x1f) & 0xfffffffeU) == window) {
    uVar7 = window / 2;
    if (1 < window) {
      uVar6 = 0;
      do {
        oup[uVar6] = sig[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    if ((int)uVar7 < (int)(N - uVar7)) {
      uVar5 = uVar7 * 2;
      uVar1 = uVar7 * 2;
      lVar8 = (long)(int)uVar7;
      lVar2 = 0;
      uVar6 = 0;
      pdVar3 = sig;
      lVar9 = lVar8;
      do {
        uVar1 = uVar1 + 1;
        dVar10 = 0.0;
        if (lVar9 - lVar8 <= lVar9 + lVar8) {
          dVar10 = 0.0;
          lVar4 = 0;
          do {
            dVar11 = pdVar3[lVar4] * 0.5 + dVar10;
            dVar12 = dVar11;
            if ((ulong)uVar5 + lVar2 != lVar4) {
              dVar12 = dVar10 + pdVar3[lVar4];
            }
            dVar10 = dVar11;
            if (lVar4 != 0) {
              dVar10 = dVar12;
            }
            lVar4 = lVar4 + 1;
          } while ((ulong)uVar1 + lVar2 != lVar4);
        }
        oup[lVar9] = dVar10 / (double)window;
        lVar9 = lVar9 + 1;
        uVar6 = uVar6 + 1;
        pdVar3 = pdVar3 + 1;
        lVar2 = lVar2 + -1;
        uVar5 = uVar5 + 1;
      } while (uVar6 != N + uVar7 * -2);
    }
    if (1 < window) {
      lVar9 = (long)(int)(N - uVar7);
      do {
        oup[lVar9] = sig[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 < N);
    }
  }
  else {
    uVar7 = (window - (window + -1 >> 0x1f)) + -1 >> 1;
    if (2 < window) {
      uVar6 = 0;
      do {
        oup[uVar6] = sig[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    if ((int)uVar7 < (int)(N - uVar7)) {
      uVar1 = uVar7 * 2;
      lVar2 = (long)(int)uVar7;
      lVar8 = 0;
      uVar6 = 0;
      pdVar3 = sig;
      lVar9 = lVar2;
      do {
        uVar1 = uVar1 + 1;
        dVar10 = 0.0;
        if (lVar9 - lVar2 <= lVar9 + lVar2) {
          lVar4 = 0;
          do {
            dVar10 = dVar10 + pdVar3[lVar4];
            lVar4 = lVar4 + 1;
          } while ((ulong)uVar1 + lVar8 != lVar4);
        }
        oup[lVar9] = dVar10 / (double)window;
        lVar9 = lVar9 + 1;
        uVar6 = uVar6 + 1;
        pdVar3 = pdVar3 + 1;
        lVar8 = lVar8 + -1;
      } while (uVar6 != N + uVar7 * -2);
    }
    if (2 < window) {
      lVar9 = (long)(int)(N - uVar7);
      do {
        oup[lVar9] = sig[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 < N);
    }
  }
  return;
}

Assistant:

void mafilter2(double *sig,int N, int window,double *oup) {
	int odd,q,N2,i,j;
	double sum;
	/*
	 * mafilter2 is a smoothing filter that smoothes a signal by using
	 * a window. No signal extension is done in this case. Instead,
	 * first floor(window/2) signal terms and last [window - floor(window/2)]
	 * terms are left untouched. The smoothing is performed over the rest
	 * of the terms.
	 *
	 */
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	if (odd) {
		for (i = 0; i < q; i++) {
			oup[i] = sig[i];
		}
		for (i = q; i < N-q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += sig[j];
			}
			oup[i] = sum /window;
		}  
		for (i = N-q; i < N; i++) {
			oup[i] = sig[i];
		}
	} else {
		for (i = 0; i < q; i++) {
			oup[i] = sig[i];
		}
		for (i = q; i < N-q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				if ( j == i - q || j == i + q) {
					sum += 0.5 * sig[j];
				} else {
					sum += sig[j];
				}
			}
			oup[i] = sum /window;
		}  
		for (i = N-q; i < N; i++) {
			oup[i] = sig[i];
		}
	}
}